

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_hal.cpp
# Opt level: O0

MPP_RET mpp_hal_flush(MppHal ctx)

{
  MppHalImpl *p;
  MppHal ctx_local;
  
  if (ctx == (MppHal)0x0) {
    _mpp_log_l(2,"mpp_hal","found NULL input\n","mpp_hal_flush");
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else if ((*(long *)((long)ctx + 8) == 0) || (*(long *)(*(long *)((long)ctx + 8) + 0x48) == 0)) {
    ctx_local._4_4_ = MPP_OK;
  }
  else {
    ctx_local._4_4_ = (**(code **)(*(long *)((long)ctx + 8) + 0x48))(*ctx);
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET mpp_hal_flush(MppHal ctx)
{
    if (NULL == ctx) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppHalImpl *p = (MppHalImpl*)ctx;

    if (NULL == p->api || NULL == p->api->flush)
        return MPP_OK;

    return p->api->flush(p->ctx);
}